

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::TransformCache::~TransformCache(TransformCache *this)

{
  bool bVar1;
  reference ppTVar2;
  Transform *in_RDI;
  Transform *tptr;
  Transform **iter;
  iterator __end1;
  iterator __begin1;
  unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
  *__range1;
  Transform *in_stack_ffffffffffffffd0;
  _Node_iterator_base<pbrt::Transform_*,_true> local_20;
  _Node_iterator_base<pbrt::Transform_*,_true> local_18;
  Float *local_10;
  
  local_10 = (in_RDI->mInv).m[2] + 2;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
       ::begin((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
                *)in_RDI);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
       ::end((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
              *)in_RDI);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = std::__detail::_Node_iterator<pbrt::Transform_*,_true,_true>::operator*
                        ((_Node_iterator<pbrt::Transform_*,_true,_true> *)0x43ab98);
    in_stack_ffffffffffffffd0 = *ppTVar2;
    pstd::pmr::polymorphic_allocator<std::byte>::delete_object<pbrt::Transform>
              ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffffd0,in_RDI);
    std::__detail::_Node_iterator<pbrt::Transform_*,_true,_true>::operator++
              ((_Node_iterator<pbrt::Transform_*,_true,_true> *)in_stack_ffffffffffffffd0);
  }
  std::
  unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
  ::~unordered_set((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
                    *)0x43abd9);
  pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource
            ((monotonic_buffer_resource *)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

TransformCache::~TransformCache() {
    for (const auto &iter : hashTable) {
        Transform *tptr = iter;
        alloc.delete_object(tptr);
    }
}